

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  string *psVar1;
  ostream *poVar2;
  string *psVar3;
  __single_object spSTM;
  shared_ptr<Status> spExecStatus;
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  resultingStatus;
  shared_ptr<Data> spData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  shared_ptr<Data> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined8 *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<Status> local_50;
  string local_40 [32];
  
  std::make_shared<Data>();
  std::make_shared<Status>();
  std::make_unique<StateMachine,std::shared_ptr<Data>&,std::shared_ptr<Status>&>
            (&local_78,&local_50);
  StateMachine::runSTM
            ((StateMachine *)local_78.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  Status::getStatusMessage_abi_cxx11_((Status *)&local_60);
  psVar1 = (string *)local_60[1];
  for (psVar3 = (string *)*local_60; psVar3 != psVar1; psVar3 = psVar3 + 0x20) {
    std::__cxx11::string::string(local_40,psVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,local_40);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_40);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::unique_ptr<StateMachine,_std::default_delete<StateMachine>_>::~unique_ptr
            ((unique_ptr<StateMachine,_std::default_delete<StateMachine>_> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main()
{
    
    auto spData{ std::make_shared<Data>() };
    auto spExecStatus{ std::make_shared<Status>() };
    auto spSTM{ std::make_unique<StateMachine>(spData, spExecStatus) };

    spSTM->runSTM();
    
    auto resultingStatus = spExecStatus->getStatusMessage();
    for(auto message : *(resultingStatus.get()) )
    {
        std::cout << message << std::endl;
    }
    return 0;

}